

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void * matras_touch(matras *m,matras_id_t id)

{
  _Bool _Var1;
  void *pvVar2;
  
  if ((m->head).block_count <= (ulong)id) {
    __assert_fail("id < m->head.block_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1fe,"void *matras_touch(struct matras *, matras_id_t)");
  }
  _Var1 = matras_needs_touch(m,id);
  if (_Var1) {
    pvVar2 = matras_touch_no_check(m,id);
    return pvVar2;
  }
  if ((ulong)id < (m->head).block_count) {
    return (void *)((ulong)((id & m->mask2) * m->block_size) +
                   *(long *)(*(long *)((long)(m->head).root +
                                      (ulong)(id >> ((byte)m->shift1 & 0x1f)) * 8) +
                            (ulong)((m->mask1 & id) >> ((byte)m->shift2 & 0x1f)) * 8));
  }
  __assert_fail("id < v->block_count",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/matras.h"
                ,0x1ab,
                "void *matras_view_get_no_check(const struct matras *, const struct matras_view *, matras_id_t)"
               );
}

Assistant:

void *
matras_touch(struct matras *m, matras_id_t id)
{
	assert(id < m->head.block_count);

	if (!matras_needs_touch(m, id))
		return matras_get(m, id);

	return matras_touch_no_check(m, id);
}